

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::InlineBuiltInLibraryCall(Lowerer *this,Instr *callInstr)

{
  Instr *pIVar1;
  code *pcVar2;
  BuiltinFunction index_00;
  bool bVar3;
  _E _Var4;
  ArgSlot AVar5;
  Opnd *pOVar6;
  Opnd *this_00;
  SymOpnd *pSVar7;
  StackSym *pSVar8;
  undefined4 *puVar9;
  LabelInstr *target;
  RegOpnd *pRVar10;
  void *pMemLoc;
  MemRefOpnd *compareSrc2;
  LabelInstr *bailOutLabelHelper;
  BranchInstr *instr_00;
  bool local_f1;
  Instr *instr;
  bool success;
  LabelInstr *doneLabel;
  Instr *startCall;
  StackSym *sym;
  Instr *argInstr;
  StackSym *sym_1;
  SymOpnd *symOpnd;
  Opnd *linkOpnd;
  Opnd *argsOpnd [3];
  Opnd *objRefOpnd;
  LabelInstr *labelHelper;
  Opnd *callTargetOpnd;
  Opnd *local_58;
  Opnd *arrayOpnd;
  StackSym *linkSym;
  long lStack_40;
  BuiltinFunction index;
  IntConstType argCount;
  StackSym *argLinkSym;
  Opnd *src2;
  Opnd *src1;
  Instr *callInstr_local;
  Lowerer *this_local;
  
  pOVar6 = IR::Instr::GetSrc1(callInstr);
  this_00 = IR::Instr::GetSrc2(callInstr);
  bVar3 = IR::Opnd::IsSymOpnd(this_00);
  if (bVar3) {
    pSVar7 = IR::Opnd::AsSymOpnd(this_00);
    pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
    AVar5 = StackSym::GetArgSlotNum(pSVar8);
    lStack_40 = (ulong)AVar5 - 1;
    linkSym._7_1_ = Func::GetBuiltInIndex(pOVar6);
    _Var4 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&linkSym + 7));
    switch(_Var4) {
    case Math_Abs:
      if (lStack_40 != 1) {
        return false;
      }
      pOVar6 = IR::Instr::GetDst(callInstr);
      if (pOVar6 == (Opnd *)0x0) {
        return false;
      }
      break;
    default:
      return false;
    case JavascriptString_CharAt:
    case JavascriptString_CharCodeAt:
      if (lStack_40 != 1) {
        return false;
      }
      pOVar6 = IR::Instr::GetDst(callInstr);
      if (pOVar6 == (Opnd *)0x0) {
        return false;
      }
      break;
    case JavascriptString_Replace:
      if (lStack_40 != 2) {
        return false;
      }
      bVar3 = ShouldGenerateStringReplaceFastPath(this,callInstr,2);
      if (!bVar3) {
        return false;
      }
      break;
    case JavascriptArray_Push:
      if (lStack_40 != 1) {
        return false;
      }
      pOVar6 = IR::Instr::GetDst(callInstr);
      if (pOVar6 != (Opnd *)0x0) {
        return false;
      }
      pOVar6 = IR::Instr::GetSrc2(callInstr);
      pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
      arrayOpnd = (Opnd *)Sym::AsStackSym(pSVar7->m_sym);
      bVar3 = StackSym::IsSingleDef((StackSym *)arrayOpnd);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2e71,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc2(*(Instr **)&arrayOpnd[2].m_valueType);
      pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
      arrayOpnd = (Opnd *)Sym::AsStackSym(pSVar7->m_sym);
      bVar3 = StackSym::IsSingleDef((StackSym *)arrayOpnd);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2e73,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      local_58 = IR::Instr::GetSrc1(*(Instr **)&arrayOpnd[2].m_valueType);
      bVar3 = IR::Opnd::IsRegOpnd(local_58);
      if (!bVar3) {
        return false;
      }
      bVar3 = ShouldGenerateArrayFastPath(this,local_58,false,false,false);
      local_f1 = true;
      if (bVar3) {
        callTargetOpnd._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(local_58);
        local_f1 = ValueType::IsLikelyNativeArray((ValueType *)((long)&callTargetOpnd + 6));
      }
      if (local_f1 != false) {
        return false;
      }
    }
    pOVar6 = IR::Instr::GetSrc1(callInstr);
    bVar3 = Func::IsBuiltInInlinedInLowerer(pOVar6);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2e9a,"(Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()))",
                         "Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1())");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pOVar6 = IR::Instr::GetSrc1(callInstr);
    target = IR::LabelInstr::New(Label,this->m_func,true);
    pRVar10 = IR::Opnd::AsRegOpnd(pOVar6);
    pMemLoc = (void *)GetObjRefForBuiltInTarget(this,pRVar10);
    compareSrc2 = IR::MemRefOpnd::New(pMemLoc,TyInt64,this->m_func,AddrOpndKindDynamicMisc);
    InsertCompareBranch(this,pOVar6,&compareSrc2->super_Opnd,BrNeq_A,target,callInstr,false);
    IR::Instr::InsertBefore(callInstr,&target->super_Instr);
    if (2 < lStack_40) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2ea6,"(argCount <= 2)","argCount <= 2");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    symOpnd = (SymOpnd *)IR::Instr::GetSrc2(callInstr);
    while (bVar3 = IR::Opnd::IsSymOpnd(&symOpnd->super_Opnd), bVar3) {
      pSVar7 = IR::Opnd::AsSymOpnd(&symOpnd->super_Opnd);
      pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
      if ((*(uint *)&pSVar8->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2eaf,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pIVar1 = (pSVar8->field_5).m_instrDef;
      if (lStack_40 < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2eb2,"(argCount >= 0)","argCount >= 0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      pOVar6 = IR::Instr::GetSrc1(pIVar1);
      argsOpnd[lStack_40 + -1] = pOVar6;
      lStack_40 = lStack_40 + -1;
      IR::Instr::Unlink(pIVar1);
      IR::Instr::InsertAfter(&target->super_Instr,pIVar1);
      symOpnd = (SymOpnd *)IR::Instr::GetSrc2(pIVar1);
    }
    if (lStack_40 != -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2ebb,"(argCount == -1)","argCount == -1");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar3 = IR::Opnd::IsRegOpnd(&symOpnd->super_Opnd);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2ebe,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pRVar10 = IR::Opnd::AsRegOpnd(&symOpnd->super_Opnd);
    pSVar8 = pRVar10->m_sym;
    if ((*(uint *)&pSVar8->field_0x18 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2ec0,"(sym->m_isSingleDef)","sym->m_isSingleDef");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pIVar1 = (pSVar8->field_5).m_instrDef;
    if (pIVar1->m_opcode != StartCall) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2ec2,"(startCall->m_opcode == Js::OpCode::StartCall)",
                         "startCall->m_opcode == Js::OpCode::StartCall");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    IR::Instr::Unlink(pIVar1);
    IR::Instr::InsertAfter(&target->super_Instr,pIVar1);
    bailOutLabelHelper = IR::LabelInstr::New(Label,this->m_func,false);
    IR::Instr::InsertAfter(callInstr,&bailOutLabelHelper->super_Instr);
    instr._7_1_ = true;
    _Var4 = Js::BuiltinFunction::operator_cast_to__E((BuiltinFunction *)((long)&linkSym + 7));
    index_00._value = linkSym._7_1_;
    switch(_Var4) {
    case Math_Abs:
      pOVar6 = IR::Instr::GetDst(callInstr);
      LowererMD::GenerateFastAbs
                (&this->m_lowererMD,pOVar6,argsOpnd[0],callInstr,&target->super_Instr,target,
                 bailOutLabelHelper);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,12000,"((0))","UNREACHED");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
      break;
    case JavascriptString_CharAt:
    case JavascriptString_CharCodeAt:
      pOVar6 = IR::Instr::GetDst(callInstr);
      instr._7_1_ = GenerateFastCharAt(this,index_00,pOVar6,linkOpnd,argsOpnd[0],callInstr,
                                       &target->super_Instr,target,bailOutLabelHelper);
      break;
    case JavascriptString_Replace:
      instr._7_1_ = GenerateFastReplace(this,linkOpnd,argsOpnd[0],argsOpnd[1],callInstr,
                                        &target->super_Instr,target,bailOutLabelHelper);
      break;
    case JavascriptArray_Push:
      instr._7_1_ = GenerateFastPush(this,linkOpnd,argsOpnd[0],callInstr,&target->super_Instr,target
                                     ,(LabelInstr *)0x0,bailOutLabelHelper,false);
    }
    instr_00 = IR::BranchInstr::New(JMP,bailOutLabelHelper,this->m_func);
    IR::Instr::InsertBefore(&target->super_Instr,&instr_00->super_Instr);
    this_local._7_1_ = instr._7_1_;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::InlineBuiltInLibraryCall(IR::Instr *callInstr)
{
    IR::Opnd *src1 = callInstr->GetSrc1();
    IR::Opnd *src2 = callInstr->GetSrc2();

    // Get the arg count by looking at the slot number of the last arg symbol.

    if (!src2->IsSymOpnd())
    {
        // No args? Not sure this is possible, but handle it.
        return false;
    }

    StackSym *argLinkSym = src2->AsSymOpnd()->m_sym->AsStackSym();
    // Subtract "this" from the arg count.
    IntConstType argCount = argLinkSym->GetArgSlotNum() - 1;

    // Find the callee's built-in index (if any).
    Js::BuiltinFunction index = Func::GetBuiltInIndex(src1);

    // Warning!
    // Don't add new built-in to following switch. Built-ins needs to be inlined in call direct way.
    // Following is only for prejit scenarios where we don't get inlining always and generate fast path in lowerer.
    // Generating fastpath here misses fixed functions and globopt optimizations.
    switch(index)
    {
        case Js::BuiltinFunction::JavascriptString_CharAt:
        case Js::BuiltinFunction::JavascriptString_CharCodeAt:
            if (argCount != 1)
            {
                return false;
            }
            if (!callInstr->GetDst())
            {
                // Optimization of Char[Code]At assumes result is used.
                return false;
            }
            break;
        case Js::BuiltinFunction::Math_Abs:
#ifdef _M_IX86
            if (!AutoSystemInfo::Data.SSE2Available())
            {
                return false;
            }
#endif
            if (argCount != 1)
            {
                return false;
            }
            if (!callInstr->GetDst())
            {
                // Optimization of Abs assumes result is used.
                return false;
            }
            break;

        case Js::BuiltinFunction::JavascriptArray_Push:
        {
            if (argCount != 1)
            {
                return false;
            }
            if (callInstr->GetDst())
            {
                // Optimization of push assumes result is unused.
                return false;
            }

            StackSym *linkSym = callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
            Assert(linkSym->IsSingleDef());
            linkSym = linkSym->m_instrDef->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
            Assert(linkSym->IsSingleDef());

            IR::Opnd *const arrayOpnd = linkSym->m_instrDef->GetSrc1();
            if(!arrayOpnd->IsRegOpnd())
            {
                // This should be rare, but needs to be handled.
                // By now, we've already started some of the inlining.  Simply jmp to the helper.
                // The branch will get peeped later.
                return false;
            }

            if(!ShouldGenerateArrayFastPath(arrayOpnd, false, false, false) ||
               arrayOpnd->GetValueType().IsLikelyNativeArray())
            {
                // Rejecting native array for now, since we have to do a FromVar at the call site and bail out.
                return false;
            }

            break;
        }

        case Js::BuiltinFunction::JavascriptString_Replace:
        {
            if(argCount != 2)
            {
                return false;
            }

            if(!ShouldGenerateStringReplaceFastPath(callInstr, argCount))
            {
                return false;
            }
            break;
        }

        default:
            return false;
    }

    Assert(Func::IsBuiltInInlinedInLowerer(callInstr->GetSrc1()));

    IR::Opnd *callTargetOpnd = callInstr->GetSrc1();

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    IR::Opnd *objRefOpnd = IR::MemRefOpnd::New((void*)this->GetObjRefForBuiltInTarget(callTargetOpnd->AsRegOpnd()), TyMachReg, this->m_func);

    InsertCompareBranch(callTargetOpnd, objRefOpnd, Js::OpCode::BrNeq_A, labelHelper, callInstr);

    callInstr->InsertBefore(labelHelper);

    Assert(argCount <= 2);

    IR::Opnd *argsOpnd[3];
    IR::Opnd *linkOpnd = callInstr->GetSrc2();

    while(linkOpnd->IsSymOpnd())
    {
        IR::SymOpnd * symOpnd = linkOpnd->AsSymOpnd();
        StackSym *sym = symOpnd->m_sym->AsStackSym();
        Assert(sym->m_isSingleDef);
        IR::Instr *argInstr = sym->m_instrDef;

        Assert(argCount >= 0);
        argsOpnd[argCount] = argInstr->GetSrc1();
        argCount--;

        argInstr->Unlink();
        labelHelper->InsertAfter(argInstr);

        linkOpnd = argInstr->GetSrc2();
    }
    AnalysisAssert(argCount == -1);

    //  Move startcall
    Assert(linkOpnd->IsRegOpnd());
    StackSym *sym = linkOpnd->AsRegOpnd()->m_sym;
    Assert(sym->m_isSingleDef);
    IR::Instr *startCall = sym->m_instrDef;
    Assert(startCall->m_opcode == Js::OpCode::StartCall);
    startCall->Unlink();
    labelHelper->InsertAfter(startCall);

    // $doneLabel:
    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    callInstr->InsertAfter(doneLabel);

    bool success = true;
    switch(index)
    {
        case Js::BuiltinFunction::Math_Abs:
            this->m_lowererMD.GenerateFastAbs(callInstr->GetDst(), argsOpnd[1], callInstr, labelHelper, labelHelper, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptString_CharCodeAt:
        case Js::BuiltinFunction::JavascriptString_CharAt:
            success = GenerateFastCharAt(index, callInstr->GetDst(), argsOpnd[0], argsOpnd[1],
                callInstr, labelHelper, labelHelper, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptArray_Push:
            success = GenerateFastPush(argsOpnd[0], argsOpnd[1], callInstr, labelHelper, labelHelper, nullptr, doneLabel);
            break;

        case Js::BuiltinFunction::JavascriptString_Replace:
            success = GenerateFastReplace(argsOpnd[0], argsOpnd[1], argsOpnd[2], callInstr, labelHelper, labelHelper, doneLabel);
            break;

        default:
            Assert(UNREACHED);
    }

    IR::Instr *instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, doneLabel, this->m_func);
    labelHelper->InsertBefore(instr);

    return success;
}